

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

bool cmState::StringToCacheEntryType(char *s,CacheEntryType *type)

{
  int iVar1;
  CacheEntryType local_24;
  int i;
  CacheEntryType *type_local;
  char *s_local;
  
  local_24 = BOOL;
  while( true ) {
    if (cmCacheEntryTypes[(int)local_24] == (char *)0x0) {
      return false;
    }
    iVar1 = strcmp(s,cmCacheEntryTypes[(int)local_24]);
    if (iVar1 == 0) break;
    local_24 = local_24 + PATH;
  }
  *type = local_24;
  return true;
}

Assistant:

bool cmState::StringToCacheEntryType(const char* s,
                                     cmStateEnums::CacheEntryType& type)
{
  int i = 0;
  while (cmCacheEntryTypes[i]) {
    if (strcmp(s, cmCacheEntryTypes[i]) == 0) {
      type = static_cast<cmStateEnums::CacheEntryType>(i);
      return true;
    }
    ++i;
  }
  return false;
}